

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.h
# Opt level: O0

VariableIndex __thiscall
dynet::ComputationGraph::add_function<dynet::MinDimension,unsigned_int&>
          (ComputationGraph *this,initializer_list<unsigned_int> *arguments,uint *side_information)

{
  size_type sVar1;
  reference ppNVar2;
  size_type sVar3;
  const_iterator puVar4;
  initializer_list<unsigned_int> *in_RSI;
  MinDimension *in_RDI;
  VariableIndex *in_stack_00000048;
  VariableIndex new_node_index;
  value_type *in_stack_ffffffffffffff98;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *in_stack_ffffffffffffffa0;
  Device *pDVar5;
  initializer_list<unsigned_int> *in_stack_ffffffffffffffa8;
  MinDimension *this_00;
  
  this_00 = in_RDI;
  sVar1 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::size
                    ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)in_RDI);
  operator_new(0x70);
  MinDimension::MinDimension
            (this_00,in_stack_ffffffffffffffa8,(uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::push_back
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ppNVar2 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::back
                      (in_stack_ffffffffffffffa0);
  if ((*ppNVar2)->device == (Device *)0x0) {
    sVar3 = std::initializer_list<unsigned_int>::size(in_RSI);
    if (sVar3 == 0) {
      pDVar5 = dynet::default_device;
      ppNVar2 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::back
                          ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)
                           dynet::default_device);
      (*ppNVar2)->device = pDVar5;
    }
    else {
      puVar4 = std::initializer_list<unsigned_int>::begin(in_RSI);
      ppNVar2 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::operator[]
                          ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)in_RDI,
                           (ulong)*puVar4);
      pDVar5 = (*ppNVar2)->device;
      ppNVar2 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::back
                          (in_stack_ffffffffffffffa0);
      (*ppNVar2)->device = pDVar5;
    }
  }
  set_dim_for_new_node((ComputationGraph *)side_information,in_stack_00000048);
  return (VariableIndex)sVar1;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments,
    Args&&... side_information) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments, std::forward<Args>(side_information)...));
  if (nodes.back()->device == nullptr) {
    if (arguments.size()) {
      nodes.back()->device = nodes[*arguments.begin()]->device;
    } else {
      nodes.back()->device = dynet::default_device;
    }
  }
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}